

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_string_define_own_property
              (JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,JSValue getter,JSValue setter
              ,int flags)

{
  JSString *p_00;
  BOOL BVar1;
  uint32_t idx_00;
  int iVar2;
  int iVar3;
  JSAtom in_ECX;
  long in_RSI;
  JSContext *in_RDI;
  JSString *in_R8;
  int in_R9D;
  uint in_stack_00000028;
  JSString *p2;
  JSString *p1;
  JSObject *p;
  uint32_t idx;
  JSAtom in_stack_0000016c;
  JSContext *in_stack_00000170;
  undefined1 in_stack_00000178 [16];
  undefined1 in_stack_00000188 [16];
  JSValue in_stack_000002a0;
  JSValue in_stack_000002b0;
  int in_stack_000002c0;
  
  BVar1 = __JS_AtomIsTaggedInt(in_ECX);
  if (((BVar1 != 0) &&
      (idx_00 = __JS_AtomToUInt32(in_ECX), (int)*(undefined8 *)(in_RSI + 0x38) == -7)) &&
     (p_00 = *(JSString **)(in_RSI + 0x30),
     idx_00 < ((uint)*(undefined8 *)&p_00->field_0x4 & 0x7fffffff))) {
    BVar1 = check_define_prop_flags(4,in_stack_00000028);
    if (BVar1 != 0) {
      if ((in_stack_00000028 & 0x2000) == 0) {
        return 1;
      }
      if ((in_R9D == -7) && (((uint)*(undefined8 *)&in_R8->field_0x4 & 0x7fffffff) == 1)) {
        iVar3 = string_get(p_00,idx_00);
        iVar2 = string_get(in_R8,0);
        if (iVar3 == iVar2) {
          return 1;
        }
      }
    }
    iVar3 = JS_ThrowTypeErrorOrFalse
                      (in_RDI,(int)(ulong)in_stack_00000028,"property is not configurable");
    return iVar3;
  }
  iVar3 = JS_DefineProperty(in_stack_00000170,(JSValue)in_stack_00000188,in_stack_0000016c,
                            (JSValue)in_stack_00000178,in_stack_000002a0,in_stack_000002b0,
                            in_stack_000002c0);
  return iVar3;
}

Assistant:

static int js_string_define_own_property(JSContext *ctx,
                                         JSValueConst this_obj,
                                         JSAtom prop, JSValueConst val,
                                         JSValueConst getter,
                                         JSValueConst setter, int flags)
{
    uint32_t idx;
    JSObject *p;
    JSString *p1, *p2;
    
    if (__JS_AtomIsTaggedInt(prop)) {
        idx = __JS_AtomToUInt32(prop);
        p = JS_VALUE_GET_OBJ(this_obj);
        if (JS_VALUE_GET_TAG(p->u.object_data) != JS_TAG_STRING)
            goto def;
        p1 = JS_VALUE_GET_STRING(p->u.object_data);
        if (idx >= p1->len)
            goto def;
        if (!check_define_prop_flags(JS_PROP_ENUMERABLE, flags))
            goto fail;
        /* check that the same value is configured */
        if (flags & JS_PROP_HAS_VALUE) {
            if (JS_VALUE_GET_TAG(val) != JS_TAG_STRING)
                goto fail;
            p2 = JS_VALUE_GET_STRING(val);
            if (p2->len != 1)
                goto fail;
            if (string_get(p1, idx) != string_get(p2, 0)) {
            fail:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "property is not configurable");
            }
        }
        return TRUE;
    } else {
    def:
        return JS_DefineProperty(ctx, this_obj, prop, val, getter, setter,
                                 flags | JS_PROP_NO_EXOTIC);
    }
}